

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockBuildSystemDelegate.h
# Opt level: O2

void __thiscall
llbuild::unittests::MockBuildSystemDelegate::commandHadNote
          (MockBuildSystemDelegate *this,Command *command,StringRef data)

{
  unique_lock<std::mutex> lock;
  StringRef local_f0;
  StringRef local_e0;
  unique_lock<std::mutex> local_d0;
  Twine local_c0;
  Twine local_a8;
  Twine local_90;
  Twine local_78;
  Twine local_60;
  string local_48;
  
  local_f0.Length = data.Length;
  local_f0.Data = data.Data;
  if (this->trackAllMessages == true) {
    std::unique_lock<std::mutex>::unique_lock(&local_d0,&this->messagesMutex);
    local_e0.Data = (command->name)._M_dataplus._M_p;
    local_e0.Length = (command->name)._M_string_length;
    llvm::Twine::Twine(&local_90,"commandNote(",&local_e0);
    llvm::Twine::Twine(&local_a8,") ");
    llvm::Twine::concat(&local_78,&local_90,&local_a8);
    llvm::Twine::Twine(&local_c0,&local_f0);
    llvm::Twine::concat(&local_60,&local_78,&local_c0);
    llvm::Twine::str_abi_cxx11_(&local_48,&local_60);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->messages,
               &local_48);
    std::__cxx11::string::_M_dispose();
    std::unique_lock<std::mutex>::~unique_lock(&local_d0);
  }
  return;
}

Assistant:

virtual void commandHadNote(Command* command, StringRef data) {
    if (trackAllMessages) {
      std::unique_lock<std::mutex> lock(messagesMutex);
      messages.push_back(("commandNote(" + command->getName() + ") " + data).str());
    }
  }